

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O2

int ecdsa_verify_wrap(mbedtls_pk_context_conflict *pk,mbedtls_md_type_t md_alg,uchar *hash,
                     size_t hash_len,uchar *sig,size_t sig_len)

{
  int iVar1;
  
  iVar1 = mbedtls_ecdsa_read_signature
                    ((mbedtls_ecdsa_context *)pk->pk_ctx,hash,hash_len,sig,sig_len);
  if (iVar1 == -0x4c00) {
    iVar1 = -0x3900;
  }
  return iVar1;
}

Assistant:

static int ecdsa_verify_wrap(mbedtls_pk_context *pk, mbedtls_md_type_t md_alg,
                             const unsigned char *hash, size_t hash_len,
                             const unsigned char *sig, size_t sig_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ((void) md_alg);

    ret = mbedtls_ecdsa_read_signature((mbedtls_ecdsa_context *) pk->pk_ctx,
                                       hash, hash_len, sig, sig_len);

    if (ret == MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) {
        return MBEDTLS_ERR_PK_SIG_LEN_MISMATCH;
    }

    return ret;
}